

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

double crnlib::image_utils::compute_block_ssim(uint t,uint8 *pX,uint8 *pY)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double d;
  double n;
  double c2;
  double c1;
  double dStack_58;
  uint i_2;
  double covar_xy;
  double dStack_48;
  uint i_1;
  double var_y;
  double var_x;
  double dStack_30;
  uint i;
  double ave_y;
  double ave_x;
  uint8 *pY_local;
  uint8 *pX_local;
  uint t_local;
  
  ave_y = 0.0;
  dStack_30 = 0.0;
  for (var_x._4_4_ = 0; var_x._4_4_ < t; var_x._4_4_ = var_x._4_4_ + 1) {
    ave_y = (double)pX[var_x._4_4_] + ave_y;
    dStack_30 = (double)pY[var_x._4_4_] + dStack_30;
  }
  dVar1 = ave_y / (double)t;
  dStack_30 = dStack_30 / (double)t;
  var_y = 0.0;
  dStack_48 = 0.0;
  for (covar_xy._4_4_ = 0; covar_xy._4_4_ < t; covar_xy._4_4_ = covar_xy._4_4_ + 1) {
    dVar2 = math::square<double>((double)pX[covar_xy._4_4_] - dVar1);
    var_y = dVar2 + var_y;
    dVar2 = math::square<double>((double)pY[covar_xy._4_4_] - dStack_30);
    dStack_48 = dVar2 + dStack_48;
  }
  dVar2 = sqrt(var_y / (double)(t - 1));
  dVar3 = sqrt(dStack_48 / (double)(t - 1));
  dStack_58 = 0.0;
  for (c1._4_4_ = 0; c1._4_4_ < t; c1._4_4_ = c1._4_4_ + 1) {
    dStack_58 = ((double)pX[c1._4_4_] - dVar1) * ((double)pY[c1._4_4_] - dStack_30) + dStack_58;
  }
  dStack_58 = dStack_58 / (double)(t - 1);
  return ((dVar1 * 2.0 * dStack_30 + 6.5025) * (dStack_58 + dStack_58 + 58.5225)) /
         ((dVar1 * dVar1 + dStack_30 * dStack_30 + 6.5025) *
         (dVar2 * dVar2 + dVar3 * dVar3 + 58.5225));
}

Assistant:

double compute_block_ssim(uint t, const uint8* pX, const uint8* pY)
        {
            double ave_x = 0.0f;
            double ave_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                ave_x += pX[i];
                ave_y += pY[i];
            }

            ave_x /= t;
            ave_y /= t;

            double var_x = 0.0f;
            double var_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                var_x += math::square(pX[i] - ave_x);
                var_y += math::square(pY[i] - ave_y);
            }

            var_x = sqrt(var_x / (t - 1));
            var_y = sqrt(var_y / (t - 1));

            double covar_xy = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                covar_xy += (pX[i] - ave_x) * (pY[i] - ave_y);
            }

            covar_xy /= (t - 1);

            const double c1 = 6.5025; //(255*.01)^2
            const double c2 = 58.5225; //(255*.03)^2

            double n = (2.0f * ave_x * ave_y + c1) * (2.0f * covar_xy + c2);
            double d = (ave_x * ave_x + ave_y * ave_y + c1) * (var_x * var_x + var_y * var_y + c2);

            return n / d;
        }